

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp.hh
# Opt level: O0

size_t __thiscall
helix::nasdaq::moldudp_session<helix::nasdaq::nordic_itch_handler>::process_packet
          (moldudp_session<helix::nasdaq::nordic_itch_handler> *this,packet_view *packet)

{
  ushort uVar1;
  ushort *puVar2;
  size_t sVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar5;
  ushort *buf;
  packet_view *in_RSI;
  long in_RDI;
  moldudp_message_block *msg_block;
  int i;
  moldudp_header *header;
  char *p;
  string *in_stack_fffffffffffffe88;
  truncated_packet_error *in_stack_fffffffffffffe90;
  packet_view *in_stack_fffffffffffffea0;
  allocator *paVar6;
  nordic_itch_handler *in_stack_fffffffffffffea8;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  int local_128;
  allocator local_d9;
  string local_d8 [96];
  string local_78 [32];
  moldudp_header *local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  ushort *local_18;
  packet_view *local_10;
  
  local_10 = in_RSI;
  local_18 = (ushort *)net::packet_view::buf(in_RSI);
  sVar3 = net::packet_view::len(local_10);
  if (sVar3 < 0x10) {
    local_4d = 1;
    uVar4 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"MoldUDP header is truncated",&local_39);
    truncated_packet_error::truncated_packet_error
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_4d = 0;
    __cxa_throw(uVar4,&truncated_packet_error::typeinfo,
                truncated_packet_error::~truncated_packet_error);
  }
  local_58 = net::packet_view::cast<moldudp_header>(local_10);
  if (local_58->SequenceNumber != *(uint32_t *)(in_RDI + 0x118)) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    __val = (uint)((ulong)in_RDI >> 0x20);
    paVar6 = &local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"invalid sequence number: ",paVar6);
    std::__cxx11::to_string(__val);
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffe90);
    std::__cxx11::to_string(__val);
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_78);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_18 = (ushort *)((long)local_18 + 0x10);
  for (local_128 = 0; puVar2 = local_18, local_128 < (int)(uint)local_58->MessageCount;
      local_128 = local_128 + 1) {
    buf = local_18 + 1;
    uVar1 = *local_18;
    local_18 = buf;
    net::packet_view::packet_view((packet_view *)&stack0xfffffffffffffec0,(char *)buf,(ulong)uVar1);
    nordic_itch_handler::process_packet(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_18 = (ushort *)((long)local_18 + (long)(int)(uint)*puVar2);
    *(int *)(in_RDI + 0x118) = *(int *)(in_RDI + 0x118) + 1;
  }
  pcVar5 = net::packet_view::buf(local_10);
  return (long)local_18 - (long)pcVar5;
}

Assistant:

size_t moldudp_session<Handler>::process_packet(const net::packet_view& packet)
{
    auto* p = packet.buf();
    if (packet.len() < sizeof(moldudp_header)) {
        throw truncated_packet_error("MoldUDP header is truncated");
    }
    auto* header = packet.cast<moldudp_header>();
    if (header->SequenceNumber != _seq_num) {
        throw std::runtime_error(std::string("invalid sequence number: ") + std::to_string(header->SequenceNumber) + ", expected: " + std::to_string(_seq_num));
    }
    p += sizeof(moldudp_header);

    for (int i = 0; i < header->MessageCount; i++) {
        auto* msg_block = reinterpret_cast<const moldudp_message_block*>(p);

        p += sizeof(moldudp_message_block);

        _handler.process_packet(net::packet_view{p, msg_block->MessageLength});

        p += msg_block->MessageLength;

        _seq_num++;
    }

    return p - packet.buf();
}